

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O2

string * __thiscall
absl::Substitute_abi_cxx11_(string *__return_storage_ptr__,absl *this,string_view format,Arg *a0)

{
  string_view format_00;
  
  format_00._M_str = (char *)format._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format_00._M_len = (size_t)this;
  SubstituteAndAppend(__return_storage_ptr__,format_00,(Arg *)format._M_str);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string Substitute(
    absl::string_view format, const substitute_internal::Arg& a0) {
  std::string result;
  SubstituteAndAppend(&result, format, a0);
  return result;
}